

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_Edition_Test::TestBody
          (FileDescriptorTest_Edition_Test *this)

{
  FileDescriptor *pFVar1;
  Arena *pAVar2;
  pointer *__ptr;
  char *in_R9;
  char *pcVar3;
  bool bVar4;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  FileDescriptorProto other;
  DescriptorPool pool;
  FileDescriptorProto proto;
  AssertHelper local_2b8;
  AssertHelper local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  undefined1 local_2a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  AssertHelper local_280;
  undefined1 local_278 [8];
  InternalMetadata local_270;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 local_268;
  DescriptorPool local_180;
  undefined1 local_108 [216];
  ArenaStringPtr local_30 [4];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108,(Arena *)0x0);
  local_108[0x10] = local_108[0x10] | 1;
  pAVar2 = (Arena *)local_108._8_8_;
  if ((local_108._8_8_ & 1) != 0) {
    pAVar2 = *(Arena **)(local_108._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(local_108 + 200),value,pAVar2);
  local_108[0x10] = local_108[0x10] | 4;
  pAVar2 = (Arena *)local_108._8_8_;
  if ((local_108._8_8_ & 1) != 0) {
    pAVar2 = *(Arena **)(local_108._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "proto2";
  value_00._M_len = 6;
  protobuf::internal::ArenaStringPtr::Set(local_30,value_00,pAVar2);
  DescriptorPool::DescriptorPool(&local_180);
  pFVar1 = DescriptorPool::BuildFile(&local_180,(FileDescriptorProto *)local_108);
  local_2a0[0] = (internal)(pFVar1 != (FileDescriptor *)0x0);
  local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pFVar1 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)local_2a0,(AssertionResult *)0x10b0e05,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1f9,(char *)CONCAT71(local_278._1_7_,local_278[0]));
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
  }
  else {
    local_2a0._0_4_ = FileDescriptor::edition(pFVar1);
    local_2b0.data_._0_4_ = 0x3e6;
    testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
              ((internal *)local_278,"FileDescriptorLegacy(file).edition()",
               "Edition::EDITION_PROTO2",(Edition *)local_2a0,(Edition *)&local_2b0);
    if (local_278[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_2a0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = *(char **)local_270.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1fa,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_2a0);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      if ((long *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_270.ptr_);
    }
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_278,(Arena *)0x0);
    FileDescriptor::CopyTo(pFVar1,(FileDescriptorProto *)local_278);
    pcVar3 = anon_var_dwarf_a22956 + 5;
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              ((internal *)local_2a0,"\"\"","other.syntax()",
               (char (*) [1])(anon_var_dwarf_a22956 + 5),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)local_268._impl_.syntax_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    if (local_2a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_2b0);
      if (local_298 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_298->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1fd,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
      testing::internal::AssertHelper::~AssertHelper(&local_2b8);
      if ((long *)CONCAT44(local_2b0.data_._4_4_,(int)local_2b0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_2b0.data_._4_4_,(int)local_2b0.data_) + 8))();
      }
    }
    if (local_298 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_298,local_298);
    }
    bVar4 = (local_268._impl_._has_bits_.has_bits_[0]._0_1_ & 0x20) == 0;
    local_2b0.data_._0_4_ = CONCAT31(local_2b0.data_._1_3_,bVar4);
    local_2a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar4) {
      testing::Message::Message((Message *)&local_2b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_2a0,(internal *)&local_2b0,(AssertionResult *)"other.has_edition()"
                 ,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_280,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1fe,(char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_));
      testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_2b8);
      testing::internal::AssertHelper::~AssertHelper(&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != &local_290) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                        local_290._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_2b8.data_._4_4_,local_2b8.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_2b8.data_._4_4_,local_2b8.data_._0_4_) + 8))();
      }
      if (local_2a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a8,local_2a8);
      }
    }
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_278);
    DescriptorPool::~DescriptorPool(&local_180);
    local_108[0x10] = local_108[0x10] | 4;
    pAVar2 = (Arena *)local_108._8_8_;
    if ((local_108._8_8_ & 1) != 0) {
      pAVar2 = *(Arena **)(local_108._8_8_ & 0xfffffffffffffffe);
    }
    value_01._M_str = "proto3";
    value_01._M_len = 6;
    protobuf::internal::ArenaStringPtr::Set(local_30,value_01,pAVar2);
    DescriptorPool::DescriptorPool(&local_180);
    pFVar1 = DescriptorPool::BuildFile(&local_180,(FileDescriptorProto *)local_108);
    local_2a0[0] = (internal)(pFVar1 != (FileDescriptor *)0x0);
    local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pFVar1 == (FileDescriptor *)0x0) {
      testing::Message::Message((Message *)&local_2b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_278,(internal *)local_2a0,(AssertionResult *)0x10b0e05,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x204,(char *)CONCAT71(local_278._1_7_,local_278[0]));
      testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
    }
    else {
      local_2a0._0_4_ = FileDescriptor::edition(pFVar1);
      local_2b0.data_._0_4_ = 999;
      testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
                ((internal *)local_278,"FileDescriptorLegacy(file).edition()",
                 "Edition::EDITION_PROTO3",(Edition *)local_2a0,(Edition *)&local_2b0);
      if (local_278[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_2a0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar3 = *(char **)local_270.ptr_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x205,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_2a0);
        testing::internal::AssertHelper::~AssertHelper(&local_2b0);
        if ((long *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_270.ptr_);
      }
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_278,(Arena *)0x0);
      FileDescriptor::CopyTo(pFVar1,(FileDescriptorProto *)local_278);
      testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
                ((internal *)local_2a0,"\"proto3\"","other.syntax()",(char (*) [7])0x119aa77,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)local_268._impl_.syntax_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      if (local_2a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_2b0);
        if (local_298 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar3 = (local_298->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x208,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_2b8);
        if ((long *)CONCAT44(local_2b0.data_._4_4_,(int)local_2b0.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_2b0.data_._4_4_,(int)local_2b0.data_) + 8))();
        }
      }
      if (local_298 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_298,local_298);
      }
      bVar4 = (local_268._impl_._has_bits_.has_bits_[0]._0_1_ & 0x20) == 0;
      local_2b0.data_._0_4_ = CONCAT31(local_2b0.data_._1_3_,bVar4);
      local_2a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar4) {
        testing::Message::Message((Message *)&local_2b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_2a0,(internal *)&local_2b0,
                   (AssertionResult *)"other.has_edition()","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_280,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x209,(char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_));
        testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_2b8);
        testing::internal::AssertHelper::~AssertHelper(&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != &local_290) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          local_290._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_2b8.data_._4_4_,local_2b8.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_2b8.data_._4_4_,local_2b8.data_._0_4_) + 8))();
        }
        if (local_2a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2a8,local_2a8);
        }
      }
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_278);
      DescriptorPool::~DescriptorPool(&local_180);
      local_108[0x10] = local_108[0x10] | 4;
      if ((local_108._8_8_ & 1) != 0) {
        local_108._8_8_ = *(undefined8 *)(local_108._8_8_ & 0xfffffffffffffffe);
      }
      value_02._M_str = "editions";
      value_02._M_len = 8;
      protobuf::internal::ArenaStringPtr::Set(local_30,value_02,(Arena *)local_108._8_8_);
      bVar4 = protobuf::internal::ValidateEnum(1000,(uint32_t *)Edition_internal_data_);
      if (!bVar4) {
        __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::Edition_internal_data_)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                      ,0x34a2,
                      "void google::protobuf::FileDescriptorProto::_internal_set_edition(::google::protobuf::Edition)"
                     );
      }
      local_30[3].tagged_ptr_.ptr_._0_4_ = 1000;
      local_108[0x10] = local_108[0x10] | 0x20;
      DescriptorPool::DescriptorPool(&local_180);
      pFVar1 = DescriptorPool::BuildFile(&local_180,(FileDescriptorProto *)local_108);
      local_2a0[0] = (internal)(pFVar1 != (FileDescriptor *)0x0);
      local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (pFVar1 != (FileDescriptor *)0x0) {
        local_2a0._0_4_ = FileDescriptor::edition(pFVar1);
        local_2b0.data_._0_4_ = 1000;
        testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
                  ((internal *)local_278,"FileDescriptorLegacy(file).edition()",
                   "Edition::EDITION_2023",(Edition *)local_2a0,(Edition *)&local_2b0);
        if (local_278[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_2a0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar3 = *(char **)local_270.ptr_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x211,pcVar3);
          testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_2a0);
          testing::internal::AssertHelper::~AssertHelper(&local_2b0);
          if ((long *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_270,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_270.ptr_);
        }
        FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_278,(Arena *)0x0);
        FileDescriptor::CopyTo(pFVar1,(FileDescriptorProto *)local_278);
        testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
                  ((internal *)local_2a0,"\"editions\"","other.syntax()",(char (*) [9])0x1195b7a,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)local_268._impl_.syntax_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
        if (local_2a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2b0);
          if (local_298 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar3 = (local_298->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x214,pcVar3);
          testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_2b8);
          if ((long *)CONCAT44(local_2b0.data_._4_4_,(int)local_2b0.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_2b0.data_._4_4_,(int)local_2b0.data_) + 8))();
          }
        }
        if (local_298 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_298,local_298);
        }
        local_2b0.data_._0_4_ = local_268._impl_.edition_;
        local_2b8.data_._0_4_ = 1000;
        testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
                  ((internal *)local_2a0,"other.edition()","EDITION_2023",(Edition *)&local_2b0,
                   (Edition *)&local_2b8);
        if (local_2a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2b0);
          if (local_298 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar3 = (local_298->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x215,pcVar3);
          testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_2b8);
          if ((long *)CONCAT44(local_2b0.data_._4_4_,(int)local_2b0.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_2b0.data_._4_4_,(int)local_2b0.data_) + 8))();
          }
        }
        if (local_298 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_298,local_298);
        }
        FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_278);
        goto LAB_0056e699;
      }
      testing::Message::Message((Message *)&local_2b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_278,(internal *)local_2a0,(AssertionResult *)0x10b0e05,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x210,(char *)CONCAT71(local_278._1_7_,local_278[0]));
      testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2b0);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_2b8);
  if ((anon_union_232_1_493b367e_for_FileDescriptorProto_3 *)CONCAT71(local_278._1_7_,local_278[0])
      != &local_268) {
    operator_delete((anon_union_232_1_493b367e_for_FileDescriptorProto_3 *)
                    CONCAT71(local_278._1_7_,local_278[0]),
                    CONCAT71(local_268._1_7_,local_268._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
  }
  if ((long *)CONCAT44(local_2b0.data_._4_4_,(int)local_2b0.data_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_2b0.data_._4_4_,(int)local_2b0.data_) + 8))();
  }
  if (local_298 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_298,local_298);
  }
LAB_0056e699:
  DescriptorPool::~DescriptorPool(&local_180);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, Edition) {
  FileDescriptorProto proto;
  proto.set_name("foo");
  {
    proto.set_syntax("proto2");
    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_TRUE(file != nullptr);
    EXPECT_EQ(FileDescriptorLegacy(file).edition(), Edition::EDITION_PROTO2);
    FileDescriptorProto other;
    file->CopyTo(&other);
    EXPECT_EQ("", other.syntax());
    EXPECT_FALSE(other.has_edition());
  }
  {
    proto.set_syntax("proto3");
    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_TRUE(file != nullptr);
    EXPECT_EQ(FileDescriptorLegacy(file).edition(), Edition::EDITION_PROTO3);
    FileDescriptorProto other;
    file->CopyTo(&other);
    EXPECT_EQ("proto3", other.syntax());
    EXPECT_FALSE(other.has_edition());
  }
  {
    proto.set_syntax("editions");
    proto.set_edition(EDITION_2023);
    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_TRUE(file != nullptr);
    EXPECT_EQ(FileDescriptorLegacy(file).edition(), Edition::EDITION_2023);
    FileDescriptorProto other;
    file->CopyTo(&other);
    EXPECT_EQ("editions", other.syntax());
    EXPECT_EQ(other.edition(), EDITION_2023);
  }
}